

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_sharded.hpp
# Opt level: O1

shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>
__thiscall
ylt::util::internal::
map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::value_type>_>_>_>
::find(map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>
       *this,key_type *key)

{
  size_type *psVar1;
  pthread_mutex_t *__mutex;
  long *plVar2;
  unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>
  *puVar3;
  bool bVar4;
  uint uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__it;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__it_00;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>
  sVar9;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>
  sVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_48;
  map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>
  *pmStack_40;
  
  __mutex = (pthread_mutex_t *)key->_M_ptr;
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key;
  uVar5 = pthread_mutex_lock(__mutex);
  if (uVar5 == 0) {
    if (key[1]._M_ptr != (pointer)0x0) {
      plVar2 = *(long **)((key[1]._M_ptr)->_M_dataplus)._M_p;
      if (plVar2 == (long *)0x0) {
        lVar8 = 0;
      }
      else {
        lVar8 = *plVar2;
      }
      if (lVar8 != 0) {
        (this->mtx_)._M_t.super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
        super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
        super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl = *(mutex **)(lVar8 + 0x10);
        puVar3 = *(unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>
                   **)(lVar8 + 0x18);
        (this->map_)._M_t.
        super___uniq_ptr_impl<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>,_std::default_delete<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_*,_std::default_delete<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>_>
        .
        super__Head_base<0UL,_std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_*,_false>
        ._M_head_impl = puVar3;
        if (puVar3 != (unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>
                       *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(puVar3->_M_h)._M_bucket_count;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(puVar3->_M_h)._M_bucket_count;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        goto LAB_0018a09f;
      }
    }
    (this->mtx_)._M_t.super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
    super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
    super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl = (mutex *)0x0;
    (this->map_)._M_t.
    super___uniq_ptr_impl<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>,_std::default_delete<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_*,_std::default_delete<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>_>
    .
    super__Head_base<0UL,_std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_*,_false>
    ._M_head_impl =
         (unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>
          *)0x0;
LAB_0018a09f:
    pthread_mutex_unlock(__mutex);
    sVar9.
    super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    sVar9.
    super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>
            )sVar9.
             super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __it = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar5;
  std::__throw_system_error(uVar5);
  lVar8 = (long)pbVar7 - (long)__it >> 7;
  _Var6._M_pi = extraout_RDX_00;
  p_Stack_48 = extraout_RDX_00;
  pmStack_40 = this;
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    __it_00 = __it;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::{lambda(auto:1&)#1}>
              ::operator()((_Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::_lambda(auto:1&)_1_>
                            *)&p_Stack_48,__it_00);
      _Var6._M_pi = extraout_RDX_01;
      __it = __it_00;
      if (bVar4) goto LAB_0018a1a9;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::{lambda(auto:1&)#1}>
              ::operator()((_Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::_lambda(auto:1&)_1_>
                            *)&p_Stack_48,__it_00 + 1);
      _Var6._M_pi = extraout_RDX_02;
      __it = __it_00 + 1;
      if (bVar4) goto LAB_0018a1a9;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::{lambda(auto:1&)#1}>
              ::operator()((_Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::_lambda(auto:1&)_1_>
                            *)&p_Stack_48,__it_00 + 2);
      _Var6._M_pi = extraout_RDX_03;
      __it = __it_00 + 2;
      if (bVar4) goto LAB_0018a1a9;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::{lambda(auto:1&)#1}>
              ::operator()((_Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::_lambda(auto:1&)_1_>
                            *)&p_Stack_48,__it_00 + 3);
      _Var6._M_pi = extraout_RDX_04;
      __it = __it_00 + 3;
      if (bVar4) goto LAB_0018a1a9;
      __it = __it_00 + 4;
      lVar8 = lVar8 + -1;
      __it_00 = __it;
    } while (1 < lVar8);
  }
  lVar8 = (long)pbVar7 - (long)__it >> 5;
  if (lVar8 == 1) {
LAB_0018a192:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::{lambda(auto:1&)#1}>
            ::operator()((_Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::_lambda(auto:1&)_1_>
                          *)&p_Stack_48,__it);
    _Var6._M_pi = extraout_RDX_07;
    if (bVar4) goto LAB_0018a1a9;
  }
  else {
    if (lVar8 == 2) {
LAB_0018a178:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::{lambda(auto:1&)#1}>
              ::operator()((_Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::_lambda(auto:1&)_1_>
                            *)&p_Stack_48,__it);
      _Var6._M_pi = extraout_RDX_06;
      if (bVar4) goto LAB_0018a1a9;
      __it = __it + 1;
      goto LAB_0018a192;
    }
    if (lVar8 == 3) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::{lambda(auto:1&)#1}>
              ::operator()((_Iter_pred<ylt::metric::basic_dynamic_counter<long,(unsigned_char)0>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::_lambda(auto:1&)_1_>
                            *)&p_Stack_48,__it);
      _Var6._M_pi = extraout_RDX_05;
      if (bVar4) goto LAB_0018a1a9;
      __it = __it + 1;
      goto LAB_0018a178;
    }
  }
  __it = pbVar7;
LAB_0018a1a9:
  sVar10.
  super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var6._M_pi;
  sVar10.
  super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)__it;
  return (shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>
          )sVar10.
           super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<typename mapped_type::element_type> find(
      const key_type& key) const {
    std::lock_guard lock(*mtx_);
    if (!map_) [[unlikely]] {
      return nullptr;
    }
    auto it = map_->find(key);
    if (it == map_->end()) {
      return nullptr;
    }
    return it->second;
  }